

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

AVisitor<hiberlite::ExtractModel> * __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::operator&
          (AVisitor<hiberlite::ExtractModel> *this,db_atom<double> *atom)

{
  db_atom<double> local_18;
  
  local_18.super_abstract_atom._vptr_abstract_atom = (_func_int **)&PTR_bindValue_001bb390;
  local_18.val = atom->val;
  ExtractModel::act<hiberlite::AVisitor<hiberlite::ExtractModel>,double>(this->actor,this,&local_18)
  ;
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(db_atom<X> atom)
{
	actor->act(*this,atom);
	return *this;
}